

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

bool __thiscall
QSQLiteResultPrivate::fetchNext
          (QSQLiteResultPrivate *this,ValueCache *values,int idx,bool initialFetch)

{
  QSqlError *this_00;
  long *plVar1;
  sqlite3 *psVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  pointer pQVar6;
  pointer pQVar7;
  sqlite3_int64 sVar8;
  char *pcVar9;
  QChar *pQVar10;
  QSQLiteDriverPrivate *pQVar11;
  undefined1 uVar12;
  int i;
  int i_00;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  undefined1 local_78 [32];
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->skipRow == true) {
    this->skipRow = false;
    lVar14 = 0;
    for (uVar13 = 0; uVar13 < (ulong)(this->firstRow).d.size; uVar13 = uVar13 + 1) {
      pQVar6 = QList<QVariant>::data(&this->firstRow);
      pQVar7 = QList<QVariant>::data(values);
      QVariant::operator=((QVariant *)((long)&(pQVar7->d).data + lVar14),
                          (QVariant *)((long)&(pQVar6->d).data + lVar14));
      lVar14 = lVar14 + 0x20;
    }
    uVar12 = this->skippedStatus;
    goto LAB_00112711;
  }
  plVar1 = *(long **)&(this->super_QSqlCachedResultPrivate).field_0x8;
  this->skipRow = initialFetch;
  if (initialFetch) {
    QList<QVariant>::clear(&this->firstRow);
    iVar5 = sqlite3_column_count(this->stmt);
    QList<QVariant>::resize(&this->firstRow,(long)iVar5);
  }
  if (this->stmt == (sqlite3_stmt *)0x0) {
    QCoreApplication::translate((char *)&local_58,"QSQLiteResult","Unable to fetch row",0);
    QCoreApplication::translate((char *)local_78,"QSQLiteResult","No query",0);
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    this_00 = (QSqlError *)(local_78 + 0x18);
    QSqlError::QSqlError
              (this_00,(QString *)&local_58,(QString *)local_78,ConnectionError,(QString *)&local_98
              );
    (**(code **)(*plVar1 + 0x28))(plVar1,this_00);
    QSqlError::~QSqlError(this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
LAB_00112700:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  else {
    iVar5 = sqlite3_step(this->stmt);
    if ((iVar5 == 1) || (iVar5 == 0x13)) {
      sqlite3_reset(this->stmt);
      pQVar11 = drv_d_func(this);
      psVar2 = pQVar11->access;
      QCoreApplication::translate((char *)&local_58,"QSQLiteResult","Unable to fetch row",0);
      qMakeError((sqlite3 *)local_78,(QString *)psVar2,(ErrorType)&local_58,1);
      (**(code **)(*plVar1 + 0x28))(plVar1,(sqlite3 *)local_78);
      QSqlError::~QSqlError((QSqlError *)local_78);
      goto LAB_00112700;
    }
    if (iVar5 == 0x65) {
      cVar4 = QSqlRecord::isEmpty();
      if (cVar4 != '\0') {
        initColumns(this,true);
      }
      (**(code **)(*plVar1 + 0x18))(plVar1,0xfffffffffffffffe);
      sqlite3_reset(this->stmt);
      uVar12 = 0;
      goto LAB_00112711;
    }
    if (iVar5 == 100) {
      cVar4 = QSqlRecord::isEmpty();
      if (cVar4 != '\0') {
        initColumns(this,false);
      }
      if (-1 < idx || initialFetch) {
        lVar15 = (long)idx << 5;
        for (lVar14 = 0; iVar5 = QSqlRecord::count(), lVar14 < iVar5; lVar14 = lVar14 + 1) {
          i_00 = (int)lVar14;
          iVar5 = sqlite3_column_type(this->stmt,i_00);
          switch(iVar5) {
          case 1:
switchD_00112456_caseD_1:
            sVar8 = sqlite3_column_int64(this->stmt,i_00);
            QVariant::QVariant(&local_58,sVar8);
            break;
          case 2:
            iVar5 = QSqlResult::numericalPrecisionPolicy();
            if (iVar5 == 2) goto switchD_00112456_caseD_1;
            if (iVar5 == 1) {
              iVar5 = sqlite3_column_int(this->stmt,i_00);
              QVariant::QVariant(&local_58,iVar5);
            }
            else {
              dVar3 = sqlite3_column_double(this->stmt,i_00);
              QVariant::QVariant(&local_58,dVar3);
            }
            break;
          default:
            pQVar10 = (QChar *)sqlite3_column_text16(this->stmt,i_00);
            iVar5 = sqlite3_column_bytes16(this->stmt,i_00);
            QString::QString((QString *)local_78,pQVar10,(ulong)(long)iVar5 >> 1);
            QVariant::QVariant(&local_58,(QString *)local_78);
            pQVar6 = QList<QVariant>::data(values);
            QVariant::operator=((QVariant *)((long)&(pQVar6->d).data + lVar15),&local_58);
            QVariant::~QVariant(&local_58);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78)
            ;
            goto LAB_001125eb;
          case 4:
            pcVar9 = (char *)sqlite3_column_blob(this->stmt,i_00);
            iVar5 = sqlite3_column_bytes(this->stmt,i_00);
            QByteArray::QByteArray((QByteArray *)local_78,pcVar9,(long)iVar5);
            QVariant::QVariant(&local_58,(QByteArray *)local_78);
            pQVar6 = QList<QVariant>::data(values);
            QVariant::operator=((QVariant *)((long)&(pQVar6->d).data + lVar15),&local_58);
            QVariant::~QVariant(&local_58);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_78);
            goto LAB_001125eb;
          case 5:
            QVariant::QVariant(&local_58,
                               (QMetaTypeInterface *)
                               &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType,(void *)0x0)
            ;
          }
          pQVar6 = QList<QVariant>::data(values);
          QVariant::operator=((QVariant *)((long)&(pQVar6->d).data + lVar15),&local_58);
          QVariant::~QVariant(&local_58);
LAB_001125eb:
          lVar15 = lVar15 + 0x20;
        }
      }
      uVar12 = 1;
      goto LAB_00112711;
    }
    pQVar11 = drv_d_func(this);
    psVar2 = pQVar11->access;
    QCoreApplication::translate((char *)&local_58,"QSQLiteResult","Unable to fetch row",0);
    qMakeError((sqlite3 *)local_78,(QString *)psVar2,
               (ErrorType)(QArrayDataPointer<char16_t> *)&local_58,1);
    (**(code **)(*plVar1 + 0x28))(plVar1,(sqlite3 *)local_78);
    QSqlError::~QSqlError((QSqlError *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    sqlite3_reset(this->stmt);
  }
  uVar12 = 0;
  (**(code **)(*plVar1 + 0x18))(plVar1,0xfffffffffffffffe);
LAB_00112711:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResultPrivate::fetchNext(QSqlCachedResult::ValueCache &values, int idx, bool initialFetch)
{
    Q_Q(QSQLiteResult);

    if (skipRow) {
        // already fetched
        Q_ASSERT(!initialFetch);
        skipRow = false;
        for(int i=0;i<firstRow.size();i++)
            values[i]=firstRow[i];
        return skippedStatus;
    }
    skipRow = initialFetch;

    if (initialFetch) {
        firstRow.clear();
        firstRow.resize(sqlite3_column_count(stmt));
    }

    if (!stmt) {
        q->setLastError(QSqlError(QCoreApplication::translate("QSQLiteResult", "Unable to fetch row"),
                                  QCoreApplication::translate("QSQLiteResult", "No query"), QSqlError::ConnectionError));
        q->setAt(QSql::AfterLastRow);
        return false;
    }
    int res = sqlite3_step(stmt);
    switch(res) {
    case SQLITE_ROW:
        // check to see if should fill out columns
        if (rInf.isEmpty())
            // must be first call.
            initColumns(false);
        if (idx < 0 && !initialFetch)
            return true;
        for (int i = 0; i < rInf.count(); ++i) {
            switch (sqlite3_column_type(stmt, i)) {
            case SQLITE_BLOB:
                values[i + idx] = QByteArray(static_cast<const char *>(
                            sqlite3_column_blob(stmt, i)),
                            sqlite3_column_bytes(stmt, i));
                break;
            case SQLITE_INTEGER:
                values[i + idx] = sqlite3_column_int64(stmt, i);
                break;
            case SQLITE_FLOAT:
                switch(q->numericalPrecisionPolicy()) {
                    case QSql::LowPrecisionInt32:
                        values[i + idx] = sqlite3_column_int(stmt, i);
                        break;
                    case QSql::LowPrecisionInt64:
                        values[i + idx] = sqlite3_column_int64(stmt, i);
                        break;
                    case QSql::LowPrecisionDouble:
                    case QSql::HighPrecision:
                    default:
                        values[i + idx] = sqlite3_column_double(stmt, i);
                        break;
                };
                break;
            case SQLITE_NULL:
                values[i + idx] = QVariant(QMetaType::fromType<QString>());
                break;
            default:
                values[i + idx] = QString(reinterpret_cast<const QChar *>(
                            sqlite3_column_text16(stmt, i)),
                            sqlite3_column_bytes16(stmt, i) / sizeof(QChar));
                break;
            }
        }
        return true;
    case SQLITE_DONE:
        if (rInf.isEmpty())
            // must be first call.
            initColumns(true);
        q->setAt(QSql::AfterLastRow);
        sqlite3_reset(stmt);
        return false;
    case SQLITE_CONSTRAINT:
    case SQLITE_ERROR:
        // SQLITE_ERROR is a generic error code and we must call sqlite3_reset()
        // to get the specific error message.
        res = sqlite3_reset(stmt);
        q->setLastError(qMakeError(drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                        "Unable to fetch row"), QSqlError::ConnectionError, res));
        q->setAt(QSql::AfterLastRow);
        return false;
    case SQLITE_MISUSE:
    case SQLITE_BUSY:
    default:
        // something wrong, don't get col info, but still return false
        q->setLastError(qMakeError(drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                        "Unable to fetch row"), QSqlError::ConnectionError, res));
        sqlite3_reset(stmt);
        q->setAt(QSql::AfterLastRow);
        return false;
    }
    return false;
}